

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O2

void __thiscall Music_Emu::handle_fade(Music_Emu *this,long out_count,sample_t_conflict1 *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = this->out_time;
  iVar2 = this->fade_start;
  iVar3 = this->fade_step;
  iVar7 = 0;
  while( true ) {
    lVar9 = (long)iVar7;
    lVar8 = out_count - lVar9;
    if (0x1ff < lVar8) {
      lVar8 = 0x200;
    }
    if (out_count <= lVar9) break;
    uVar4 = (long)((iVar1 + iVar7) - iVar2) / 0x200;
    uVar4 = (ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
    iVar5 = ((int)((long)uVar4 % (long)iVar3) << 0xe) / iVar3;
    iVar5 = ((iVar5 >> 1) - iVar5) + 0x4000 >> ((byte)((long)uVar4 / (long)iVar3) & 0x1f);
    if (iVar5 < 0x40) {
      this->emu_track_ended_ = true;
      this->track_ended_ = true;
    }
    for (lVar6 = 0; (int)lVar8 != (int)lVar6; lVar6 = lVar6 + 1) {
      out[lVar9 + lVar6] = (sample_t_conflict1)((uint)(out[lVar9 + lVar6] * iVar5) >> 0xe);
    }
    iVar7 = iVar7 + 0x200;
  }
  return;
}

Assistant:

void Music_Emu::handle_fade( long out_count, sample_t* out )
{
	for ( int i = 0; i < out_count; i += fade_block_size )
	{
		int const shift = 14;
		int const unit = 1 << shift;
		int gain = int_log( (out_time + i - fade_start) / fade_block_size,
				fade_step, unit );
		if ( gain < (unit >> fade_shift) )
			track_ended_ = emu_track_ended_ = true;
		
		sample_t* io = &out [i];
		for ( int count = min( fade_block_size, out_count - i ); count; --count )
		{
			*io = sample_t ((*io * gain) >> shift);
			++io;
		}
	}
}